

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O2

void duckdb::ArrowVarcharData<duckdb::hugeint_t,_duckdb::ArrowUUIDConverter,_int>::
     AppendTemplated<false>
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  idx_t iVar1;
  ArrowBuffer *this;
  ArrowBuffer *buffer;
  ArrowBuffer *this_00;
  ulong uVar2;
  InvalidInputException *this_01;
  unsigned_long *buf;
  int iVar3;
  ulong params_1;
  ulong uVar4;
  long lVar5;
  long lVar6;
  hugeint_t input_00;
  allocator local_c9;
  ArrowAppendData *local_c8;
  idx_t local_c0;
  long local_b8;
  data_ptr_t local_b0;
  data_ptr_t local_a8;
  data_ptr_t local_a0;
  string local_98;
  UnifiedVectorFormat format;
  
  local_c0 = to;
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  this = ArrowAppendData::GetMainBuffer(append_data);
  buffer = ArrowAppendData::GetValidityBuffer(append_data);
  this_00 = ArrowAppendData::GetAuxBuffer(append_data);
  lVar5 = local_c0 - from;
  ResizeValidity(buffer,append_data->row_count + lVar5);
  local_b0 = buffer->dataptr;
  local_c8 = append_data;
  ArrowBuffer::resize(this,this->count + lVar5 * 4 + 4);
  local_a8 = format.data;
  local_a0 = this->dataptr;
  iVar1 = local_c8->row_count;
  if (iVar1 == 0) {
    local_a0[0] = '\0';
    local_a0[1] = '\0';
    local_a0[2] = '\0';
    local_a0[3] = '\0';
  }
  params_1 = (ulong)*(uint *)(local_a0 + iVar1 * 4);
  lVar6 = 0;
  local_b8 = lVar5;
  do {
    if (local_c0 <= from) {
      local_c8->row_count = local_c8->row_count + local_b8;
      UnifiedVectorFormat::~UnifiedVectorFormat(&format);
      return;
    }
    uVar4 = from;
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(format.sel)->sel_vector[from];
    }
    uVar2 = local_c8->row_count + lVar6;
    iVar3 = (int)params_1;
    buf = format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       (buf = (unsigned_long *)
              format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6],
       ((ulong)buf >> (uVar4 & 0x3f) & 1) != 0)) {
      params_1 = (long)iVar3 + 0x24;
      if ((params_1 & 0xffffffff80000000) != 0) {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_98,
                   "Arrow Appender: The maximum total string size for regular string buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string buffers"
                   ,&local_c9);
        InvalidInputException::InvalidInputException<int,unsigned_long>
                  (this_01,&local_98,0x7fffffff,params_1);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      *(int *)(local_a0 + (uVar2 + 1) * 4) = (int)params_1;
      ArrowBuffer::resize(this_00,params_1);
      input_00.upper = (int64_t)(this_00->dataptr + iVar3);
      input_00.lower = *(uint64_t *)(local_a8 + uVar4 * 0x10 + 8);
      BaseUUID::ToString(*(BaseUUID **)(local_a8 + uVar4 * 0x10),input_00,(char *)buf);
    }
    else {
      local_b0[uVar2 >> 3] = local_b0[uVar2 >> 3] & ~(byte)(1L << ((byte)uVar2 & 7));
      local_c8->null_count = local_c8->null_count + 1;
      *(int *)(local_a0 + (uVar2 + 1) * 4) = iVar3;
    }
    from = from + 1;
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static void AppendTemplated(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();

		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(append_data.row_count + i - from, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				offset_data[offset_idx] = last_offset;
				continue;
			}

			auto string_length = OP::GetLength(data[source_idx]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			if (!LARGE_STRING &&
			    UnsafeNumericCast<idx_t>(last_offset) + string_length > NumericLimits<int32_t>::Maximum()) {
				D_ASSERT(append_data.options.arrow_offset_size == ArrowOffsetSize::REGULAR);
				throw InvalidInputException(
				    "Arrow Appender: The maximum total string size for regular string buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), current_offset);
			}
			offset_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			OP::WriteData(aux_buffer.data() + last_offset, data[source_idx]);

			last_offset = UnsafeNumericCast<BUFTYPE>(current_offset);
		}
		append_data.row_count += size;
	}